

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_variables.c
# Opt level: O2

ngx_int_t ngx_http_variable_request_time
                    (ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  u_char *buf;
  ulong uVar1;
  u_char *puVar2;
  ulong uVar3;
  
  buf = (u_char *)ngx_pnalloc(r->pool,0x18);
  if (buf == (u_char *)0x0) {
    uVar3 = 0xffffffffffffffff;
  }
  else {
    uVar1 = (ngx_cached_time->msec - r->start_msec) + (ngx_cached_time->sec - r->start_sec) * 1000;
    uVar3 = 0;
    if ((long)uVar1 < 1) {
      uVar1 = uVar3;
    }
    puVar2 = ngx_sprintf(buf,"%T.%03M",uVar1 / 1000,uVar1 % 1000);
    *(uint *)v = ((int)puVar2 - (int)buf & 0xfffffffU) + (*(uint *)v & 0x80000000) + 0x10000000;
    v->data = buf;
  }
  return uVar3;
}

Assistant:

static ngx_int_t
ngx_http_variable_request_time(ngx_http_request_t *r,
    ngx_http_variable_value_t *v, uintptr_t data)
{
    u_char          *p;
    ngx_time_t      *tp;
    ngx_msec_int_t   ms;

    p = ngx_pnalloc(r->pool, NGX_TIME_T_LEN + 4);
    if (p == NULL) {
        return NGX_ERROR;
    }

    tp = ngx_timeofday();

    ms = (ngx_msec_int_t)
             ((tp->sec - r->start_sec) * 1000 + (tp->msec - r->start_msec));
    ms = ngx_max(ms, 0);

    v->len = ngx_sprintf(p, "%T.%03M", (time_t) ms / 1000, ms % 1000) - p;
    v->valid = 1;
    v->no_cacheable = 0;
    v->not_found = 0;
    v->data = p;

    return NGX_OK;
}